

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

bool pstore::command_line::details::
     parse_command_line_options<char*const*,std::ostream,std::ostream>
               (char **first_arg,char **last_arg,string *overview,
               basic_ostream<char,_std::char_traits<char>_> *outs,
               basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  string program_name;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> help;
  allocator local_199;
  name local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> local_f8;
  
  std::__cxx11::string::string((string *)&local_f8,*first_arg,(allocator *)&local_198);
  pstore::path::posix::base_name(&local_178,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_118,(string *)&local_178);
  std::__cxx11::string::string((string *)&local_138,(string *)overview);
  std::__cxx11::string::string((string *)&local_158,"help",&local_199);
  command_line::name::name(&local_198,&local_158);
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::help<pstore::command_line::name>
            (&local_f8,&local_118,&local_138,outs,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  parse_option_arguments<char*const*,std::ostream>
            ((details *)&local_198,first_arg + 1,last_arg,&local_178,errs);
  if (local_198.name_._M_dataplus._M_p._0_1_ != (allocator)0x0) {
    bVar1 = parse_positional_arguments<char*const*>
                      ((char **)local_198.name_._M_string_length,last_arg);
    if (bVar1) {
      bVar1 = check_for_missing<std::ostream>(&local_178,errs);
      goto LAB_001092db;
    }
  }
  bVar1 = false;
LAB_001092db:
  help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help(&local_f8);
  std::__cxx11::string::~string((string *)&local_178);
  return bVar1;
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }